

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void mg_set_handler_type(mg_context *phys_ctx,mg_domain_context *dom_ctx,char *uri,int handler_type,
                        int is_delete_request,mg_request_handler handler,
                        mg_websocket_subprotocols *subprotocols,
                        mg_websocket_connect_handler connect_handler,
                        mg_websocket_ready_handler ready_handler,
                        mg_websocket_data_handler data_handler,
                        mg_websocket_close_handler close_handler,
                        mg_authorization_handler auth_handler,void *cbdata)

{
  int iVar1;
  mg_handler_info *pmVar2;
  long *a;
  char *pcVar3;
  size_t urilen;
  mg_handler_info **lastref;
  mg_handler_info *tmp_rh;
  mg_request_handler handler_local;
  int is_delete_request_local;
  int handler_type_local;
  char *uri_local;
  mg_domain_context *dom_ctx_local;
  mg_context *phys_ctx_local;
  
  pmVar2 = (mg_handler_info *)strlen(uri);
  if (handler_type == 1) {
    if (handler != (mg_request_handler)0x0) {
      return;
    }
    if ((((is_delete_request == 0) && (connect_handler == (mg_websocket_connect_handler)0x0)) &&
        (ready_handler == (mg_websocket_ready_handler)0x0)) &&
       ((data_handler == (mg_websocket_data_handler)0x0 &&
        (close_handler == (mg_websocket_close_handler)0x0)))) {
      return;
    }
  }
  else {
    if (handler_type != 0) {
      if (handler_type != 2) {
        return;
      }
      if (handler != (mg_request_handler)0x0) {
        return;
      }
      if (connect_handler != (mg_websocket_connect_handler)0x0) {
        return;
      }
      if (ready_handler != (mg_websocket_ready_handler)0x0) {
        return;
      }
      if (data_handler != (mg_websocket_data_handler)0x0) {
        return;
      }
      if (close_handler != (mg_websocket_close_handler)0x0) {
        return;
      }
      if ((is_delete_request == 0) && (auth_handler == (mg_authorization_handler)0x0)) {
        return;
      }
      goto LAB_001370e9;
    }
    if (connect_handler != (mg_websocket_connect_handler)0x0) {
      return;
    }
    if (ready_handler != (mg_websocket_ready_handler)0x0) {
      return;
    }
    if (data_handler != (mg_websocket_data_handler)0x0) {
      return;
    }
    if (close_handler != (mg_websocket_close_handler)0x0) {
      return;
    }
    if ((is_delete_request == 0) && (handler == (mg_request_handler)0x0)) {
      return;
    }
  }
  if (auth_handler != (mg_authorization_handler)0x0) {
    return;
  }
LAB_001370e9:
  if ((phys_ctx != (mg_context *)0x0) && (dom_ctx != (mg_domain_context *)0x0)) {
    mg_lock_context(phys_ctx);
    do {
      urilen = (size_t)&dom_ctx->handlers;
      for (lastref = (mg_handler_info **)dom_ctx->handlers; lastref != (mg_handler_info **)0x0;
          lastref = (mg_handler_info **)lastref[0xc]) {
        if (((*(int *)(lastref + 2) == handler_type) && (pmVar2 == lastref[1])) &&
           (iVar1 = strcmp((char *)*lastref,uri), iVar1 == 0)) {
          if (is_delete_request == 0) {
            if (handler_type == 0) {
              if (*(int *)(lastref + 4) != 0) {
                mg_unlock_context(phys_ctx);
                usleep(1000);
                mg_lock_context(phys_ctx);
                break;
              }
              lastref[3] = (mg_handler_info *)handler;
            }
            else if (handler_type == 1) {
              lastref[9] = (mg_handler_info *)subprotocols;
              lastref[5] = (mg_handler_info *)connect_handler;
              lastref[6] = (mg_handler_info *)ready_handler;
              lastref[7] = (mg_handler_info *)data_handler;
              lastref[8] = (mg_handler_info *)close_handler;
            }
            else {
              lastref[10] = (mg_handler_info *)auth_handler;
            }
            lastref[0xb] = (mg_handler_info *)cbdata;
          }
          else {
            if ((handler_type == 0) && (*(int *)(lastref + 4) != 0)) {
              *(undefined4 *)((long)lastref + 0x24) = 1;
              mg_unlock_context(phys_ctx);
              usleep(1000);
              mg_lock_context(phys_ctx);
              break;
            }
            *(mg_handler_info **)urilen = lastref[0xc];
            mg_free(*lastref);
            mg_free(lastref);
          }
          mg_unlock_context(phys_ctx);
          return;
        }
        urilen = (size_t)(lastref + 0xc);
      }
    } while (lastref != (mg_handler_info **)0x0);
    if (is_delete_request == 0) {
      a = (long *)mg_calloc(1,0x68);
      if (a == (long *)0x0) {
        mg_unlock_context(phys_ctx);
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,phys_ctx,"mg_set_handler_type",0x385e,"%s",
                   "Cannot create new request handler struct, OOM");
      }
      else {
        pcVar3 = mg_strdup_ctx(uri,phys_ctx);
        *a = (long)pcVar3;
        if (*a == 0) {
          mg_unlock_context(phys_ctx);
          mg_free(a);
          mg_cry_internal_wrap
                    ((mg_connection *)0x0,phys_ctx,"mg_set_handler_type",0x3867,"%s",
                     "Cannot create new request handler struct, OOM");
        }
        else {
          a[1] = (long)pmVar2;
          if (handler_type == 0) {
            *(undefined4 *)(a + 4) = 0;
            *(undefined4 *)((long)a + 0x24) = 0;
            a[3] = (long)handler;
          }
          else if (handler_type == 1) {
            a[9] = (long)subprotocols;
            a[5] = (long)connect_handler;
            a[6] = (long)ready_handler;
            a[7] = (long)data_handler;
            a[8] = (long)close_handler;
          }
          else {
            a[10] = (long)auth_handler;
          }
          a[0xb] = (long)cbdata;
          *(int *)(a + 2) = handler_type;
          a[0xc] = 0;
          *(long **)urilen = a;
          mg_unlock_context(phys_ctx);
        }
      }
    }
    else {
      mg_unlock_context(phys_ctx);
    }
  }
  return;
}

Assistant:

static void
mg_set_handler_type(struct mg_context *phys_ctx,
                    struct mg_domain_context *dom_ctx,
                    const char *uri,
                    int handler_type,
                    int is_delete_request,
                    mg_request_handler handler,
                    struct mg_websocket_subprotocols *subprotocols,
                    mg_websocket_connect_handler connect_handler,
                    mg_websocket_ready_handler ready_handler,
                    mg_websocket_data_handler data_handler,
                    mg_websocket_close_handler close_handler,
                    mg_authorization_handler auth_handler,
                    void *cbdata)
{
	struct mg_handler_info *tmp_rh, **lastref;
	size_t urilen = strlen(uri);

	if (handler_type == WEBSOCKET_HANDLER) {
		DEBUG_ASSERT(handler == NULL);
		DEBUG_ASSERT(is_delete_request || connect_handler != NULL
		             || ready_handler != NULL || data_handler != NULL
		             || close_handler != NULL);

		DEBUG_ASSERT(auth_handler == NULL);
		if (handler != NULL) {
			return;
		}
		if (!is_delete_request && (connect_handler == NULL)
		    && (ready_handler == NULL) && (data_handler == NULL)
		    && (close_handler == NULL)) {
			return;
		}
		if (auth_handler != NULL) {
			return;
		}

	} else if (handler_type == REQUEST_HANDLER) {
		DEBUG_ASSERT(connect_handler == NULL && ready_handler == NULL
		             && data_handler == NULL && close_handler == NULL);
		DEBUG_ASSERT(is_delete_request || (handler != NULL));
		DEBUG_ASSERT(auth_handler == NULL);

		if ((connect_handler != NULL) || (ready_handler != NULL)
		    || (data_handler != NULL) || (close_handler != NULL)) {
			return;
		}
		if (!is_delete_request && (handler == NULL)) {
			return;
		}
		if (auth_handler != NULL) {
			return;
		}

	} else if (handler_type == AUTH_HANDLER) {
		DEBUG_ASSERT(handler == NULL);
		DEBUG_ASSERT(connect_handler == NULL && ready_handler == NULL
		             && data_handler == NULL && close_handler == NULL);
		DEBUG_ASSERT(is_delete_request || (auth_handler != NULL));
		if (handler != NULL) {
			return;
		}
		if ((connect_handler != NULL) || (ready_handler != NULL)
		    || (data_handler != NULL) || (close_handler != NULL)) {
			return;
		}
		if (!is_delete_request && (auth_handler == NULL)) {
			return;
		}
	} else {
		/* Unknown handler type. */
		return;
	}

	if (!phys_ctx || !dom_ctx) {
		/* no context available */
		return;
	}

	mg_lock_context(phys_ctx);

	/* first try to find an existing handler */
	do {
		lastref = &(dom_ctx->handlers);
		for (tmp_rh = dom_ctx->handlers; tmp_rh != NULL;
		     tmp_rh = tmp_rh->next) {
			if (tmp_rh->handler_type == handler_type
			    && (urilen == tmp_rh->uri_len) && !strcmp(tmp_rh->uri, uri)) {
				if (!is_delete_request) {
					/* update existing handler */
					if (handler_type == REQUEST_HANDLER) {
						/* Wait for end of use before updating */
						if (tmp_rh->refcount) {
							mg_unlock_context(phys_ctx);
							mg_sleep(1);
							mg_lock_context(phys_ctx);
							/* tmp_rh might have been freed, search again. */
							break;
						}
						/* Ok, the handler is no more use -> Update it */
						tmp_rh->handler = handler;
					} else if (handler_type == WEBSOCKET_HANDLER) {
						tmp_rh->subprotocols = subprotocols;
						tmp_rh->connect_handler = connect_handler;
						tmp_rh->ready_handler = ready_handler;
						tmp_rh->data_handler = data_handler;
						tmp_rh->close_handler = close_handler;
					} else { /* AUTH_HANDLER */
						tmp_rh->auth_handler = auth_handler;
					}
					tmp_rh->cbdata = cbdata;
				} else {
					/* remove existing handler */
					if (handler_type == REQUEST_HANDLER) {
						/* Wait for end of use before removing */
						if (tmp_rh->refcount) {
							tmp_rh->removing = 1;
							mg_unlock_context(phys_ctx);
							mg_sleep(1);
							mg_lock_context(phys_ctx);
							/* tmp_rh might have been freed, search again. */
							break;
						}
						/* Ok, the handler is no more used */
					}
					*lastref = tmp_rh->next;
					mg_free(tmp_rh->uri);
					mg_free(tmp_rh);
				}
				mg_unlock_context(phys_ctx);
				return;
			}
			lastref = &(tmp_rh->next);
		}
	} while (tmp_rh != NULL);

	if (is_delete_request) {
		/* no handler to set, this was a remove request to a non-existing
		 * handler */
		mg_unlock_context(phys_ctx);
		return;
	}

	tmp_rh =
	    (struct mg_handler_info *)mg_calloc_ctx(1,
	                                            sizeof(struct mg_handler_info),
	                                            phys_ctx);
	if (tmp_rh == NULL) {
		mg_unlock_context(phys_ctx);
		mg_cry_ctx_internal(phys_ctx,
		                    "%s",
		                    "Cannot create new request handler struct, OOM");
		return;
	}
	tmp_rh->uri = mg_strdup_ctx(uri, phys_ctx);
	if (!tmp_rh->uri) {
		mg_unlock_context(phys_ctx);
		mg_free(tmp_rh);
		mg_cry_ctx_internal(phys_ctx,
		                    "%s",
		                    "Cannot create new request handler struct, OOM");
		return;
	}
	tmp_rh->uri_len = urilen;
	if (handler_type == REQUEST_HANDLER) {
		tmp_rh->refcount = 0;
		tmp_rh->removing = 0;
		tmp_rh->handler = handler;
	} else if (handler_type == WEBSOCKET_HANDLER) {
		tmp_rh->subprotocols = subprotocols;
		tmp_rh->connect_handler = connect_handler;
		tmp_rh->ready_handler = ready_handler;
		tmp_rh->data_handler = data_handler;
		tmp_rh->close_handler = close_handler;
	} else { /* AUTH_HANDLER */
		tmp_rh->auth_handler = auth_handler;
	}
	tmp_rh->cbdata = cbdata;
	tmp_rh->handler_type = handler_type;
	tmp_rh->next = NULL;

	*lastref = tmp_rh;
	mg_unlock_context(phys_ctx);
}